

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_sse2.c
# Opt level: O3

uint64_t SharpYuvUpdateY_SSE2(uint16_t *ref,uint16_t *src,uint16_t *dst,int len,int bit_depth)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  short sVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint16_t uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar14;
  int iVar15;
  undefined1 auVar13 [16];
  int iVar16;
  short sVar17;
  ushort uVar18;
  short sVar19;
  ushort uVar20;
  short sVar21;
  ushort uVar22;
  short sVar23;
  ushort uVar24;
  short sVar25;
  ushort uVar26;
  short sVar27;
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  auVar5 = _DAT_001bda40;
  uVar11 = ~(-1 << ((byte)bit_depth & 0x1f));
  if (len < 8) {
    uVar10 = 0;
    iVar12 = 0;
    iVar14 = 0;
    iVar15 = 0;
    iVar16 = 0;
  }
  else {
    auVar13 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
    iVar12 = 0;
    iVar14 = 0;
    iVar15 = 0;
    iVar16 = 0;
    uVar7 = 0;
    do {
      puVar1 = ref + uVar7;
      puVar2 = src + uVar7;
      auVar34._0_2_ = *puVar1 - *puVar2;
      auVar34._2_2_ = puVar1[1] - puVar2[1];
      auVar34._4_2_ = puVar1[2] - puVar2[2];
      auVar34._6_2_ = puVar1[3] - puVar2[3];
      auVar34._8_2_ = puVar1[4] - puVar2[4];
      auVar34._10_2_ = puVar1[5] - puVar2[5];
      auVar34._12_2_ = puVar1[6] - puVar2[6];
      auVar34._14_2_ = puVar1[7] - puVar2[7];
      puVar1 = dst + uVar7;
      auVar33 = psraw(auVar34,0xf);
      sVar17 = *puVar1 + auVar34._0_2_;
      sVar19 = puVar1[1] + auVar34._2_2_;
      sVar21 = puVar1[2] + auVar34._4_2_;
      sVar23 = puVar1[3] + auVar34._6_2_;
      sVar25 = puVar1[4] + auVar34._8_2_;
      sVar27 = puVar1[5] + auVar34._10_2_;
      sVar29 = puVar1[6] + auVar34._12_2_;
      sVar31 = puVar1[7] + auVar34._14_2_;
      sVar3 = auVar13._0_2_;
      uVar18 = (ushort)(sVar3 < sVar17) * sVar3 | (ushort)(sVar3 >= sVar17) * sVar17;
      sVar17 = auVar13._2_2_;
      uVar20 = (ushort)(sVar17 < sVar19) * sVar17 | (ushort)(sVar17 >= sVar19) * sVar19;
      uVar22 = (ushort)(sVar3 < sVar21) * sVar3 | (ushort)(sVar3 >= sVar21) * sVar21;
      uVar24 = (ushort)(sVar17 < sVar23) * sVar17 | (ushort)(sVar17 >= sVar23) * sVar23;
      uVar26 = (ushort)(sVar3 < sVar25) * sVar3 | (ushort)(sVar3 >= sVar25) * sVar25;
      uVar28 = (ushort)(sVar17 < sVar27) * sVar17 | (ushort)(sVar17 >= sVar27) * sVar27;
      uVar30 = (ushort)(sVar3 < sVar29) * sVar3 | (ushort)(sVar3 >= sVar29) * sVar29;
      uVar32 = (ushort)(sVar17 < sVar31) * sVar17 | (ushort)(sVar17 >= sVar31) * sVar31;
      auVar34 = pmaddwd(auVar33 | auVar5,auVar34);
      iVar12 = iVar12 + auVar34._0_4_;
      iVar14 = iVar14 + auVar34._4_4_;
      iVar15 = iVar15 + auVar34._8_4_;
      iVar16 = iVar16 + auVar34._12_4_;
      puVar1 = dst + uVar7;
      *puVar1 = (-1 < (short)uVar18) * uVar18;
      puVar1[1] = (-1 < (short)uVar20) * uVar20;
      puVar1[2] = (-1 < (short)uVar22) * uVar22;
      puVar1[3] = (-1 < (short)uVar24) * uVar24;
      puVar1[4] = (-1 < (short)uVar26) * uVar26;
      puVar1[5] = (-1 < (short)uVar28) * uVar28;
      puVar1[6] = (-1 < (short)uVar30) * uVar30;
      puVar1[7] = (-1 < (short)uVar32) * uVar32;
      uVar10 = uVar7 + 8;
      uVar6 = uVar7 + 0x10;
      uVar7 = uVar10;
    } while (uVar6 <= (uint)len);
  }
  uVar7 = (ulong)(uint)(iVar16 + iVar14 + iVar15 + iVar12);
  if ((int)uVar10 < len) {
    uVar10 = uVar10 & 0xffffffff;
    do {
      iVar12 = (uint)ref[uVar10] - (uint)src[uVar10];
      uVar8 = (uint)dst[uVar10] + iVar12;
      uVar4 = uVar11;
      if ((int)uVar8 < (int)uVar11) {
        uVar4 = uVar8;
      }
      uVar9 = (uint16_t)uVar4;
      if ((int)uVar8 < 0) {
        uVar9 = 0;
      }
      dst[uVar10] = uVar9;
      uVar18 = -(ushort)iVar12;
      if (0 < iVar12) {
        uVar18 = (ushort)iVar12;
      }
      uVar7 = uVar7 + uVar18;
      uVar10 = uVar10 + 1;
    } while ((uint)len != uVar10);
  }
  return uVar7;
}

Assistant:

static uint64_t SharpYuvUpdateY_SSE2(const uint16_t* ref, const uint16_t* src,
                                     uint16_t* dst, int len, int bit_depth) {
  const int max_y = (1 << bit_depth) - 1;
  uint64_t diff = 0;
  uint32_t tmp[4];
  int i;
  const __m128i zero = _mm_setzero_si128();
  const __m128i max = _mm_set1_epi16(max_y);
  const __m128i one = _mm_set1_epi16(1);
  __m128i sum = zero;

  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i A = _mm_loadu_si128((const __m128i*)(ref + i));
    const __m128i B = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i C = _mm_loadu_si128((const __m128i*)(dst + i));
    const __m128i D = _mm_sub_epi16(A, B);       // diff_y
    const __m128i E = _mm_cmpgt_epi16(zero, D);  // sign (-1 or 0)
    const __m128i F = _mm_add_epi16(C, D);       // new_y
    const __m128i G = _mm_or_si128(E, one);      // -1 or 1
    const __m128i H = _mm_max_epi16(_mm_min_epi16(F, max), zero);
    const __m128i I = _mm_madd_epi16(D, G);      // sum(abs(...))
    _mm_storeu_si128((__m128i*)(dst + i), H);
    sum = _mm_add_epi32(sum, I);
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  diff = tmp[3] + tmp[2] + tmp[1] + tmp[0];
  for (; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_SSE2(new_y, max_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}